

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

bool __thiscall crunch::parse_mipmap_params(crunch *this,crn_mipmap_params *mip_params)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  float fVar4;
  dynamic_string local_58;
  crn_mip_filter local_48;
  undefined4 local_44;
  uint32 i_1;
  uint32 i;
  undefined1 local_30 [8];
  dynamic_string val;
  crn_mipmap_params *mip_params_local;
  crunch *this_local;
  
  val.m_pStr = (char *)mip_params;
  crnlib::dynamic_string::dynamic_string((dynamic_string *)local_30);
  bVar1 = crnlib::command_line_params::get_value_as_string
                    (&this->m_params,"mipMode",0,(dynamic_string *)local_30,0);
  if (bVar1) {
    for (i_1 = 0; i_1 < 4; i_1 = i_1 + 1) {
      pcVar3 = crn_get_mip_mode_name(i_1);
      bVar1 = crnlib::dynamic_string::operator==((dynamic_string *)local_30,pcVar3);
      if (bVar1) {
        *(uint32 *)(val.m_pStr + 4) = i_1;
        break;
      }
    }
    if (i_1 == 4) {
      pcVar3 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_30);
      crnlib::console::error("Invalid MipMode: \"%s\"",pcVar3);
      this_local._7_1_ = false;
      goto LAB_00115478;
    }
  }
  bVar1 = crnlib::command_line_params::get_value_as_string
                    (&this->m_params,"mipFilter",0,(dynamic_string *)local_30,0);
  if (bVar1) {
    for (local_48 = cCRNMipFilterBox; local_48 < cCRNMipFilterTotal;
        local_48 = local_48 + cCRNMipFilterTent) {
      pcVar3 = crn_get_mip_filter_name(local_48);
      crnlib::dynamic_string::dynamic_string(&local_58,pcVar3);
      bVar1 = crnlib::dynamic_string::operator==((dynamic_string *)local_30,&local_58);
      crnlib::dynamic_string::~dynamic_string(&local_58);
      if (bVar1) {
        *(crn_mip_filter *)(val.m_pStr + 8) = local_48;
        break;
      }
    }
    if (local_48 == cCRNMipFilterTotal) {
      pcVar3 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_30);
      crnlib::console::error("Invalid MipFilter: \"%s\"",pcVar3);
      this_local._7_1_ = false;
      goto LAB_00115478;
    }
    if (local_48 == cCRNMipFilterBox) {
      val.m_pStr[0x14] = '\0';
      val.m_pStr[0x15] = '\0';
      val.m_pStr[0x16] = -0x80;
      val.m_pStr[0x17] = '?';
    }
  }
  fVar4 = crnlib::command_line_params::get_value_as_float
                    (&this->m_params,"gamma",0,*(float *)(val.m_pStr + 0x10),0.1,8.0,0);
  *(float *)(val.m_pStr + 0x10) = fVar4;
  *(uint *)(val.m_pStr + 0xc) = -(uint)(*(float *)(val.m_pStr + 0x10) != 1.0) & 1;
  fVar4 = crnlib::command_line_params::get_value_as_float
                    (&this->m_params,"blurriness",0,*(float *)(val.m_pStr + 0x14),0.01,8.0,0);
  *(float *)(val.m_pStr + 0x14) = fVar4;
  bVar1 = crnlib::command_line_params::get_value_as_bool
                    (&this->m_params,"renormalize",0,*(int *)(val.m_pStr + 0x20) != 0);
  *(uint *)(val.m_pStr + 0x20) = (uint)bVar1;
  bVar1 = crnlib::command_line_params::get_value_as_bool
                    (&this->m_params,"rtopmip",0,*(int *)(val.m_pStr + 0x24) != 0);
  *(uint *)(val.m_pStr + 0x24) = (uint)bVar1;
  bVar1 = crnlib::command_line_params::get_value_as_bool(&this->m_params,"wrap",0,false);
  *(uint *)(val.m_pStr + 0x28) = (uint)bVar1;
  iVar2 = crnlib::command_line_params::get_value_as_int(&this->m_params,"maxmips",0,0x10,1,0x10,0);
  *(int *)(val.m_pStr + 0x18) = iVar2;
  iVar2 = crnlib::command_line_params::get_value_as_int(&this->m_params,"minmipsize",0,1,1,0x1000,0)
  ;
  *(int *)(val.m_pStr + 0x1c) = iVar2;
  this_local._7_1_ = true;
LAB_00115478:
  local_44 = 1;
  crnlib::dynamic_string::~dynamic_string((dynamic_string *)local_30);
  return this_local._7_1_;
}

Assistant:

bool parse_mipmap_params(crn_mipmap_params& mip_params)
    {
        dynamic_string val;

        if (m_params.get_value_as_string("mipMode", 0, val))
        {
            uint32 i;
            for (i = 0; i < cCRNMipModeTotal; i++)
            {
                if (val == crn_get_mip_mode_name(static_cast<crn_mip_mode>(i)))
                {
                    mip_params.m_mode = static_cast<crn_mip_mode>(i);
                    break;
                }
            }
            if (i == cCRNMipModeTotal)
            {
                console::error("Invalid MipMode: \"%s\"", val.get_ptr());
                return false;
            }
        }

        if (m_params.get_value_as_string("mipFilter", 0, val))
        {
            uint32 i;
            for (i = 0; i < cCRNMipFilterTotal; i++)
            {
                if (val == dynamic_string(crn_get_mip_filter_name(static_cast<crn_mip_filter>(i))))
                {
                    mip_params.m_filter = static_cast<crn_mip_filter>(i);
                    break;
                }
            }

            if (i == cCRNMipFilterTotal)
            {
                console::error("Invalid MipFilter: \"%s\"", val.get_ptr());
                return false;
            }

            if (i == cCRNMipFilterBox)
            {
                mip_params.m_blurriness = 1.0f;
            }
        }

        mip_params.m_gamma = m_params.get_value_as_float("gamma", 0, mip_params.m_gamma, .1f, 8.0f);
        mip_params.m_gamma_filtering = (mip_params.m_gamma != 1.0f);

        mip_params.m_blurriness = m_params.get_value_as_float("blurriness", 0, mip_params.m_blurriness, .01f, 8.0f);

        mip_params.m_renormalize = m_params.get_value_as_bool("renormalize", 0, mip_params.m_renormalize != 0);
        mip_params.m_rtopmip = m_params.get_value_as_bool("rtopmip", 0, mip_params.m_rtopmip != 0);
        mip_params.m_tiled = m_params.get_value_as_bool("wrap");

        mip_params.m_max_levels = m_params.get_value_as_int("maxmips", 0, cCRNMaxLevels, 1, cCRNMaxLevels);
        mip_params.m_min_mip_size = m_params.get_value_as_int("minmipsize", 0, 1, 1, cCRNMaxLevelResolution);

        return true;
    }